

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveQueries.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShaderPrimitiveQueries::iterate(GeometryShaderPrimitiveQueries *this)

{
  ostringstream *poVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  GLuint GVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_00;
  char *description;
  qpTestResult testResult;
  pointer_____offset_0x10___ *ppuVar8;
  TestContext *this_01;
  GLuint nTFPrimitivesWritten;
  GLuint nPrimitivesGenerated;
  char *gs_code;
  char *tf_varyings [1];
  undefined1 local_1b0 [384];
  long lVar7;
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              ((NotSupportedError *)this_00,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
               ,0x150);
    ppuVar8 = &tcu::NotSupportedError::typeinfo;
LAB_00cf1870:
    __cxa_throw(this_00,ppuVar8,tcu::Exception::~Exception);
  }
  GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar5;
  GVar5 = (**(code **)(lVar7 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar5;
  GVar5 = (**(code **)(lVar7 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_gs_id = GVar5;
  GVar5 = (**(code **)(lVar7 + 0x3c8))();
  this->m_po_id = GVar5;
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Error creating program/shader objects.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x159);
  tf_varyings[0] = "gl_Position";
  iVar4 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])(this);
  gs_code = (char *)CONCAT44(extraout_var_00,iVar4);
  (**(code **)(lVar7 + 0x14c8))(this->m_po_id,1,tf_varyings,0x8c8d);
  bVar3 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&m_fs_code,
                     this->m_gs_id,1,&gs_code,this->m_vs_id,1,&m_vs_code,(bool *)0x0);
  if (!bVar3) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Could not create a program for GeometryShaderPrimitiveQueries!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
               ,0x165);
    ppuVar8 = &tcu::TestError::typeinfo;
    goto LAB_00cf1870;
  }
  (**(code **)(lVar7 + 0x708))(1,&this->m_vao_id);
  (**(code **)(lVar7 + 0xd8))(this->m_vao_id);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Error creating a vertex array object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x16c);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_bo_large_id);
  (**(code **)(lVar7 + 0x6c8))(1,&this->m_bo_small_id);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_bo_large_id);
  pcVar2 = *(code **)(lVar7 + 0x150);
  iVar4 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (*pcVar2)(0x8892,(long)(iVar4 * this->m_n_texture_components) << 2,0,0x88e4);
  (**(code **)(lVar7 + 0x40))(0x8892,this->m_bo_small_id);
  pcVar2 = *(code **)(lVar7 + 0x150);
  iVar4 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])(this);
  (*pcVar2)(0x8892,(long)((iVar4 / 2) * this->m_n_texture_components) << 2,0,0x88e4);
  dVar6 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar6,"Error allocating buffer objects.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderPrimitiveQueries.cpp"
                  ,0x180);
  (**(code **)(lVar7 + 0x6e0))(1,&this->m_qo_tf_primitives_written_id);
  (**(code **)(lVar7 + 0x6e0))(1,&this->m_qo_primitives_generated_id);
  nPrimitivesGenerated = 0;
  nTFPrimitivesWritten = 0;
  readPrimitiveQueryValues(this,this->m_bo_large_id,&nPrimitivesGenerated,&nTFPrimitivesWritten);
  if (nPrimitivesGenerated == 0) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),
                    "Retrieved GL_PRIMITIVES_GENERATED_EXT query object value is zero which should never happen."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else if (nTFPrimitivesWritten == 0) {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 8),
                    "Retrieved GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query object value is zero which should never happen."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else if (nPrimitivesGenerated == nTFPrimitivesWritten) {
    nPrimitivesGenerated = 0;
    nTFPrimitivesWritten = 0;
    readPrimitiveQueryValues(this,this->m_bo_small_id,&nPrimitivesGenerated,&nTFPrimitivesWritten);
    if (nPrimitivesGenerated == 0) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Retrieved GL_PRIMITIVES_GENERATED_EXT query object value is zero which should never happen."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else if (nTFPrimitivesWritten == 0) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "Retrieved GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query object value is zero which should never happen."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (nPrimitivesGenerated >> 1 == nTFPrimitivesWritten) {
        this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
        description = "Pass";
        testResult = QP_TEST_RESULT_PASS;
        goto LAB_00cf17f0;
      }
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,
                      "Retrieved GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query object value(");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,
                      ") should be half the amount of GL_PRIMITIVES_GENERATED_EXT (");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,")");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Retrieved GL_PRIMITIVES_GENERATED_EXT query object value(");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,
                    ") is different than for GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN (");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,")");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  this_01 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00cf17f0:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderPrimitiveQueries::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check if geometry_shader extension is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create shader objects and a program object */
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating program/shader objects.");

	/* Try to build test-specific program object */
	const char* tf_varyings[] = { "gl_Position" };
	const char* gs_code		  = getGeometryShaderCode();

	gl.transformFeedbackVaryings(m_po_id, sizeof(tf_varyings) / sizeof(tf_varyings[0]), tf_varyings,
								 GL_SEPARATE_ATTRIBS);

	if (!buildProgram(m_po_id, m_fs_id, 1 /* part */, &m_fs_code, m_gs_id, 1 /* part */, &gs_code, m_vs_id,
					  1 /* part */, &m_vs_code))
	{
		TCU_FAIL("Could not create a program for GeometryShaderPrimitiveQueries!");
	}

	/* Create and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error creating a vertex array object.");

	/* Create two buffer objects
	 *
	 * One with sufficiently large storage space to hold position data for particular output.
	 * Another one of insufficient size.
	 */
	gl.genBuffers(1, &m_bo_large_id);
	gl.genBuffers(1, &m_bo_small_id);

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_large_id);
	gl.bufferData(GL_ARRAY_BUFFER,
				  getAmountOfEmittedVertices() * m_n_texture_components /* components */ * sizeof(float), NULL,
				  GL_STATIC_DRAW);

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_small_id);
	gl.bufferData(GL_ARRAY_BUFFER,
				  (getAmountOfEmittedVertices() / 2) * m_n_texture_components /* components */ * sizeof(float), NULL,
				  GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Error allocating buffer objects.");

	/* Create primitive query objects */
	gl.genQueries(1, &m_qo_tf_primitives_written_id);
	gl.genQueries(1, &m_qo_primitives_generated_id);

	glw::GLuint nPrimitivesGenerated = 0;
	glw::GLuint nTFPrimitivesWritten = 0;

	/* Test case 13.1 */
	readPrimitiveQueryValues(m_bo_large_id, &nPrimitivesGenerated, &nTFPrimitivesWritten);

	if (nPrimitivesGenerated == 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Retrieved GL_PRIMITIVES_GENERATED_EXT query object value is zero which should never happen."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	if (nTFPrimitivesWritten == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Retrieved GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query "
													   "object value is zero which should never happen."
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	if (nPrimitivesGenerated != nTFPrimitivesWritten)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Retrieved GL_PRIMITIVES_GENERATED_EXT query object value("
						   << nPrimitivesGenerated
						   << ") is different than for GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN ("
						   << nTFPrimitivesWritten << ")" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	/* Test case 13.2 */
	nPrimitivesGenerated = 0;
	nTFPrimitivesWritten = 0;

	readPrimitiveQueryValues(m_bo_small_id, &nPrimitivesGenerated, &nTFPrimitivesWritten);

	if (nPrimitivesGenerated == 0)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Retrieved GL_PRIMITIVES_GENERATED_EXT query object value is zero which should never happen."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	if (nTFPrimitivesWritten == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Retrieved GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query "
													   "object value is zero which should never happen."
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	if ((nPrimitivesGenerated / 2) != nTFPrimitivesWritten)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Retrieved GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN query object value("
						   << nPrimitivesGenerated << ") should be half the amount of GL_PRIMITIVES_GENERATED_EXT ("
						   << nTFPrimitivesWritten << ")" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}